

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

bool __thiscall
gss::innards::HomomorphismSearcher::propagate_simple_constraints
          (HomomorphismSearcher *this,Domains *new_domains,
          HomomorphismAssignment *current_assignment)

{
  bool bVar1;
  uint uVar2;
  iterator this_00;
  iterator d_00;
  reference current_assignment_00;
  HomomorphismSearcher *in_RDX;
  HomomorphismDomain *in_RSI;
  HomomorphismSearcher *in_RDI;
  HomomorphismDomain *d;
  iterator __end1;
  iterator __begin1;
  Domains *__range1;
  uint in_stack_00000058;
  uint in_stack_0000005c;
  HomomorphismSearcher *in_stack_00000060;
  HomomorphismAssignment *in_stack_00000130;
  HomomorphismDomain *in_stack_00000138;
  HomomorphismSearcher *in_stack_00000140;
  HomomorphismDomain *in_stack_00000148;
  HomomorphismSearcher *in_stack_00000150;
  HomomorphismAssignment *in_stack_000001a0;
  HomomorphismDomain *in_stack_000001a8;
  HomomorphismSearcher *in_stack_000001b0;
  HomomorphismDomain *in_stack_000001b8;
  HomomorphismSearcher *in_stack_000001c0;
  HomomorphismDomain *in_stack_000001c8;
  HomomorphismSearcher *in_stack_000001d0;
  HomomorphismAssignment *in_stack_000001e0;
  HomomorphismDomain *in_stack_000001e8;
  HomomorphismSearcher *in_stack_000001f0;
  HomomorphismAssignment *in_stack_00000310;
  HomomorphismDomain *in_stack_00000318;
  HomomorphismSearcher *in_stack_00000320;
  HomomorphismAssignment *in_stack_00000330;
  HomomorphismDomain *in_stack_00000338;
  HomomorphismSearcher *in_stack_00000340;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  Injectivity in_stack_ffffffffffffffb4;
  HomomorphismDomain *d_01;
  HomomorphismSearcher *this_01;
  
  d_01 = in_RSI;
  this_01 = in_RDI;
  this_00 = std::
            vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            ::begin(in_stack_ffffffffffffffa8);
  d_00 = std::
         vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
         ::end(in_stack_ffffffffffffffa8);
  do {
    bVar1 = __gnu_cxx::
            operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                      ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    current_assignment_00 =
         __gnu_cxx::
         __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
         ::operator*((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                      *)&stack0xffffffffffffffd0);
    if ((current_assignment_00->fixed & 1U) == 0) {
      in_stack_ffffffffffffffb4 = in_RDI->params->injectivity;
      if (in_stack_ffffffffffffffb4 == Injective) {
        SVOBitset::reset((SVOBitset *)this_00._M_current,(int)((ulong)d_00._M_current >> 0x20));
      }
      else if ((in_stack_ffffffffffffffb4 == LocallyInjective) &&
              (bVar1 = both_in_the_neighbourhood_of_some_vertex
                                 (in_stack_00000060,in_stack_0000005c,in_stack_00000058), bVar1)) {
        SVOBitset::reset((SVOBitset *)this_00._M_current,(int)((ulong)d_00._M_current >> 0x20));
      }
      bVar1 = HomomorphismModel::has_edge_labels((HomomorphismModel *)0x187677);
      if (bVar1) {
        if ((in_RDI->params->induced & 1U) == 0) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->proof);
          if (bVar1) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1878b7);
            bVar1 = Proof::super_extra_verbose((Proof *)0x1878bf);
            if (bVar1) {
              propagate_adjacency_constraints<true,true,false,true>
                        (in_stack_00000320,in_stack_00000318,in_stack_00000310);
              goto LAB_001878f1;
            }
          }
          propagate_adjacency_constraints<true,true,false,false>
                    (in_stack_00000140,in_stack_00000138,in_stack_00000130);
        }
        else {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->proof);
          if (bVar1) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x18785d);
            bVar1 = Proof::super_extra_verbose((Proof *)0x187865);
            if (bVar1) {
              propagate_adjacency_constraints<true,true,true,true>
                        (in_stack_00000340,in_stack_00000338,in_stack_00000330);
              goto LAB_001878f1;
            }
          }
          propagate_adjacency_constraints<true,true,true,false>
                    (in_stack_00000150,in_stack_00000148,(HomomorphismAssignment *)in_stack_00000140
                    );
        }
      }
      else if ((in_RDI->params->induced & 1U) == 0) {
        bVar1 = HomomorphismModel::directed((HomomorphismModel *)0x18776b);
        if (bVar1) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->proof);
          if (bVar1) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x187793);
            bVar1 = Proof::super_extra_verbose((Proof *)0x18779b);
            if (bVar1) {
              propagate_adjacency_constraints<true,false,false,true>
                        (in_stack_000001d0,in_stack_000001c8,
                         (HomomorphismAssignment *)in_stack_000001c0);
              goto LAB_001878f1;
            }
          }
          propagate_adjacency_constraints<true,false,false,false>
                    (in_RDX,in_RSI,(HomomorphismAssignment *)this_00._M_current);
        }
        else {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->proof);
          if (bVar1) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1877ed);
            bVar1 = Proof::super_extra_verbose((Proof *)0x1877f5);
            if (bVar1) {
              propagate_adjacency_constraints<false,false,false,true>
                        (in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
              goto LAB_001878f1;
            }
          }
          propagate_adjacency_constraints<false,false,false,false>
                    ((HomomorphismSearcher *)this_00._M_current,d_00._M_current,
                     (HomomorphismAssignment *)current_assignment_00);
        }
      }
      else {
        bVar1 = HomomorphismModel::directed((HomomorphismModel *)0x18769f);
        if (bVar1) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->proof);
          if (bVar1) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1876c7);
            bVar1 = Proof::super_extra_verbose((Proof *)0x1876cf);
            if (bVar1) {
              propagate_adjacency_constraints<true,false,true,true>
                        (in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
              goto LAB_001878f1;
            }
          }
          propagate_adjacency_constraints<true,false,true,false>
                    (this_01,d_01,(HomomorphismAssignment *)in_RDX);
        }
        else {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->proof);
          if (bVar1) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x187721);
            bVar1 = Proof::super_extra_verbose((Proof *)0x187729);
            if (bVar1) {
              propagate_adjacency_constraints<false,false,true,true>
                        (in_stack_000001c0,in_stack_000001b8,
                         (HomomorphismAssignment *)in_stack_000001b0);
              goto LAB_001878f1;
            }
          }
          propagate_adjacency_constraints<false,false,true,false>
                    ((HomomorphismSearcher *)this_00._M_current,d_00._M_current,
                     (HomomorphismAssignment *)current_assignment_00);
        }
      }
LAB_001878f1:
      uVar2 = SVOBitset::count((SVOBitset *)this_00._M_current);
      current_assignment_00->count = uVar2;
      if (current_assignment_00->count == 0) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
    ::operator++((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                  *)&stack0xffffffffffffffd0);
  } while( true );
}

Assistant:

auto HomomorphismSearcher::propagate_simple_constraints(Domains & new_domains, const HomomorphismAssignment & current_assignment) -> bool
{
    // propagate for each remaining domain...
    for (auto & d : new_domains) {
        if (d.fixed)
            continue;

        // injectivity
        switch (params.injectivity) {
        case Injectivity::Injective:
            d.values.reset(current_assignment.target_vertex);
            break;
        case Injectivity::LocallyInjective:
            if (both_in_the_neighbourhood_of_some_vertex(current_assignment.pattern_vertex, d.v))
                d.values.reset(current_assignment.target_vertex);
            break;
        case Injectivity::NonInjective:
            break;
        }

        // adjacency
        if (! model.has_edge_labels()) {
            if (params.induced) {
                if (model.directed()) {
                    if ((! proof) || (! proof->super_extra_verbose()))
                        propagate_adjacency_constraints<true, false, true, false>(d, current_assignment);
                    else
                        propagate_adjacency_constraints<true, false, true, true>(d, current_assignment);
                }
                else {
                    if ((! proof) || (! proof->super_extra_verbose()))
                        propagate_adjacency_constraints<false, false, true, false>(d, current_assignment);
                    else
                        propagate_adjacency_constraints<false, false, true, true>(d, current_assignment);
                }
            }
            else {
                if (model.directed()) {
                    if ((! proof) || (! proof->super_extra_verbose()))
                        propagate_adjacency_constraints<true, false, false, false>(d, current_assignment);
                    else
                        propagate_adjacency_constraints<true, false, false, true>(d, current_assignment);
                }
                else {
                    if ((! proof) || (! proof->super_extra_verbose()))
                        propagate_adjacency_constraints<false, false, false, false>(d, current_assignment);
                    else
                        propagate_adjacency_constraints<false, false, false, true>(d, current_assignment);
                }
            }
        }
        else {
            // edge labels are always directed
            if (params.induced) {
                if ((! proof) || (! proof->super_extra_verbose()))
                    propagate_adjacency_constraints<true, true, true, false>(d, current_assignment);
                else
                    propagate_adjacency_constraints<true, true, true, true>(d, current_assignment);
            }
            else {
                if ((! proof) || (! proof->super_extra_verbose()))
                    propagate_adjacency_constraints<true, true, false, false>(d, current_assignment);
                else
                    propagate_adjacency_constraints<true, true, false, true>(d, current_assignment);
            }
        }

        // we might have removed values
        d.count = d.values.count();
        if (0 == d.count)
            return false;
    }

    return true;
}